

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O3

void __thiscall embree::ISPCQuadMesh::commit(ISPCQuadMesh *this)

{
  RTCGeometry pRVar1;
  ulong uVar2;
  
  pRVar1 = (this->geom).geometry;
  rtcSetGeometryTimeStepCount(pRVar1,this->numTimeSteps);
  rtcSetGeometryTimeRange(this->startTime,this->endTime,pRVar1);
  if (this->numTimeSteps != 0) {
    uVar2 = 0;
    do {
      rtcSetSharedGeometryBuffer
                (pRVar1,1,uVar2 & 0xffffffff,0x9003,this->positions[uVar2],0,0x10,this->numVertices)
      ;
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->numTimeSteps);
  }
  rtcSetSharedGeometryBuffer(pRVar1,0,0,0x5004,this->quads,0,0x10,this->numQuads);
  rtcSetGeometryUserData(pRVar1,this);
  if (assignShadersFunc != (AssignShaderTy)0x0) {
    (*assignShadersFunc)(&this->geom);
  }
  rtcCommitGeometry(pRVar1);
  return;
}

Assistant:

void ISPCQuadMesh::commit()
  {
    RTCGeometry g = geom.geometry;
    rtcSetGeometryTimeStepCount(g,numTimeSteps);
    rtcSetGeometryTimeRange(g,startTime,endTime);
  
    for (unsigned int t=0; t<numTimeSteps; t++) {
      rtcSetSharedGeometryBuffer(g, RTC_BUFFER_TYPE_VERTEX, t, RTC_FORMAT_FLOAT3, positions[t], 0, sizeof(Vec3fa), numVertices);
    }
    rtcSetSharedGeometryBuffer(g, RTC_BUFFER_TYPE_INDEX, 0, RTC_FORMAT_UINT4, quads, 0, sizeof(ISPCQuad), numQuads);
    rtcSetGeometryUserData(g, this);
    
    if (assignShadersFunc) assignShadersFunc(&geom);
    rtcCommitGeometry(g);
  }